

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loss.c
# Opt level: O2

void test_time_detection(void)

{
  quicly_sentmap_t *map;
  int iVar1;
  uint16_t uVar2;
  quicly_loss_t local_c8;
  
  now = 0;
  num_packets_lost = 0;
  map = &local_c8.sentmap;
  local_c8.conf = &quicly_spec_context.loss;
  local_c8.max_ack_delay = &quicly_spec_context.transport_params.max_ack_delay;
  local_c8.ack_delay_exponent = &quicly_spec_context.transport_params.ack_delay_exponent;
  local_c8.pto_count = '\0';
  local_c8.time_of_last_packet_sent = 0;
  local_c8.largest_acked_packet_plus1[0] = 0;
  local_c8.largest_acked_packet_plus1[1] = 0;
  local_c8.largest_acked_packet_plus1[2] = 0;
  local_c8.largest_acked_packet_plus1[3] = 0;
  local_c8.total_bytes_sent = 0;
  local_c8.loss_time = 0x7fffffffffffffff;
  local_c8.alarm_at = 0x7fffffffffffffff;
  local_c8.rtt.minimum = 0xffffffff;
  local_c8.rtt.smoothed = 0x14;
  local_c8.rtt.variance = 10;
  local_c8.rtt.latest = 0;
  local_c8.sentmap.head = (st_quicly_sent_block_t *)0x0;
  local_c8.sentmap.tail = (st_quicly_sent_block_t *)0x0;
  local_c8.sentmap.num_packets = 0;
  local_c8.sentmap.bytes_in_flight = 0;
  local_c8.sentmap._pending_packet = (quicly_sent_t *)0x0;
  _ok(1,"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/loss.c");
  iVar1 = quicly_sentmap_prepare(map,0,now,'\0');
  uVar2 = 0x11f;
  _ok((uint)(iVar1 == 0),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/loss.c");
  quicly_sentmap_commit(map,uVar2);
  iVar1 = quicly_sentmap_prepare(map,1,now,'\0');
  uVar2 = 0x11f;
  _ok((uint)(iVar1 == 0),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/loss.c");
  quicly_sentmap_commit(map,uVar2);
  iVar1 = quicly_sentmap_prepare(map,2,now,'\0');
  uVar2 = 0x11f;
  _ok((uint)(iVar1 == 0),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/loss.c");
  quicly_sentmap_commit(map,uVar2);
  iVar1 = quicly_loss_detect_loss(&local_c8,now,0,0,on_loss_detected);
  _ok((uint)(iVar1 == 0),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/loss.c",0x44);
  _ok((uint)(local_c8.loss_time == 0x7fffffffffffffff),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/loss.c");
  now = now + 10;
  acked(&local_c8,0,0);
  iVar1 = quicly_loss_detect_loss(&local_c8,now,0,0,on_loss_detected);
  _ok((uint)(iVar1 == 0),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/loss.c",0x4b);
  _ok((uint)(local_c8.loss_time == 0x7fffffffffffffff),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/loss.c");
  now = now + 10;
  acked(&local_c8,2,0);
  iVar1 = quicly_loss_detect_loss(&local_c8,now,0,0,on_loss_detected);
  _ok((uint)(iVar1 == 0),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/loss.c",0x52);
  _ok((uint)(local_c8.loss_time != 0x7fffffffffffffff),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/loss.c",0x53);
  _ok((uint)(num_packets_lost == 0),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/loss.c");
  now = local_c8.loss_time;
  iVar1 = quicly_loss_detect_loss(&local_c8,local_c8.loss_time,0,0,on_loss_detected);
  _ok((uint)(iVar1 == 0),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/loss.c",0x57);
  _ok((uint)(local_c8.loss_time == 0x7fffffffffffffff),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/loss.c",0x58);
  _ok((uint)(num_packets_lost == 1),"%s %d",
      "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/t/loss.c",0x59);
  quicly_sentmap_dispose(map);
  return;
}

Assistant:

static void test_time_detection(void)
{
    quicly_loss_t loss;

    now = 0;
    num_packets_lost = 0;

    quicly_loss_init(&loss, &quicly_spec_context.loss, 20, &quicly_spec_context.transport_params.max_ack_delay,
                     &quicly_spec_context.transport_params.ack_delay_exponent);
    ok(loss.loss_time == INT64_MAX);

    /* commit 3 packets (pn=0..2); check that loss timer is not active */
    ok(quicly_sentmap_prepare(&loss.sentmap, 0, now, QUICLY_EPOCH_INITIAL) == 0);
    quicly_sentmap_commit(&loss.sentmap, 10);
    ok(quicly_sentmap_prepare(&loss.sentmap, 1, now, QUICLY_EPOCH_INITIAL) == 0);
    quicly_sentmap_commit(&loss.sentmap, 10);
    ok(quicly_sentmap_prepare(&loss.sentmap, 2, now, QUICLY_EPOCH_INITIAL) == 0);
    quicly_sentmap_commit(&loss.sentmap, 10);
    ok(quicly_loss_detect_loss(&loss, now, quicly_spec_context.transport_params.max_ack_delay, 0, on_loss_detected) == 0);
    ok(loss.loss_time == INT64_MAX);

    now += 10;

    /* receive ack for the 1st packet; check that loss timer is not active */
    acked(&loss, 0, QUICLY_EPOCH_INITIAL);
    ok(quicly_loss_detect_loss(&loss, now, quicly_spec_context.transport_params.max_ack_delay, 0, on_loss_detected) == 0);
    ok(loss.loss_time == INT64_MAX);

    now += 10;

    /* receive ack for the 3rd packet; check that loss timer is active */
    acked(&loss, 2, QUICLY_EPOCH_INITIAL);
    ok(quicly_loss_detect_loss(&loss, now, quicly_spec_context.transport_params.max_ack_delay, 0, on_loss_detected) == 0);
    ok(loss.loss_time != INT64_MAX);
    ok(num_packets_lost == 0);

    now = loss.loss_time;
    ok(quicly_loss_detect_loss(&loss, now, quicly_spec_context.transport_params.max_ack_delay, 0, on_loss_detected) == 0);
    ok(loss.loss_time == INT64_MAX);
    ok(num_packets_lost == 1);

    quicly_loss_dispose(&loss);
}